

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O3

feed_db_status_t import_csv_file_db(char *path,char *table,feed_db_t *db)

{
  char **ppcVar1;
  feed_db_t *pfVar2;
  int iVar3;
  uint field_count;
  int iVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i_2;
  size_t i;
  ulong uVar9;
  sqlite3_stmt *stmt;
  char **record_values;
  char **field_names;
  char *insert_query;
  char *error_msg;
  char *create_query;
  sqlite3_stmt *local_70;
  FILE *local_68;
  char **local_60;
  char **local_58;
  feed_db_t *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    pcVar6 = "Failed to open .csv file";
  }
  else {
    local_60 = (char **)0x0;
    iVar3 = count_lines((FILE *)__stream);
    if (iVar3 < 1) {
      fclose(__stream);
      pcVar6 = "Failed to count lines in CSV file";
    }
    else {
      local_58 = (char **)0x0;
      field_count = read_header((FILE *)__stream,&local_58);
      if (-1 < (int)field_count) {
        local_68 = __stream;
        bake_create_uni_query_db(table,field_count,local_58,&local_38);
        iVar4 = sqlite3_exec(db->conn,local_38,(sqlite3_callback)0x0,(void *)0x0,&local_40);
        db->rc = iVar4;
        free(local_38);
        ppcVar1 = local_58;
        uVar7 = (ulong)field_count;
        if (local_58 != (char **)0x0) {
          if (field_count != 0) {
            uVar9 = 0;
            do {
              free(ppcVar1[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar7 != uVar9);
          }
          free(ppcVar1);
        }
        if (db->rc != 0) {
          if (local_40 == (char *)0x0) {
            pcVar6 = strdup("Failed to create a table");
            db->error_msg = pcVar6;
          }
          else {
            pcVar6 = strdup(local_40);
            db->error_msg = pcVar6;
            sqlite3_free(local_40);
          }
          fclose(local_68);
          return FEED_DB_ERROR;
        }
        bake_insert_uni_query_db(table,field_count,&local_48);
        iVar4 = 0;
        sqlite3_prepare_v2(db->conn,local_48,-1,&local_70,(char **)0x0);
        if (iVar3 != 1) {
          iVar3 = iVar3 + -1;
          uVar9 = 1;
          if (1 < (int)field_count) {
            uVar9 = (ulong)field_count;
          }
          local_50 = db;
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          do {
            iVar5 = read_record((FILE *)local_68,field_count,&local_60);
            if (0 < iVar5) {
              if (field_count != 0) {
                uVar8 = 0;
                do {
                  ppcVar1 = local_60 + uVar8;
                  uVar8 = uVar8 + 1;
                  sqlite3_bind_text(local_70,(int)uVar8,*ppcVar1,-1,(_func_void_void_ptr *)0x0);
                } while (uVar9 != uVar8);
              }
              iVar5 = sqlite3_step(local_70);
              db->rc = iVar5;
              if (iVar5 != 0x65) {
                fclose(local_68);
                free(local_48);
                ppcVar1 = local_60;
                if (local_60 != (char **)0x0) {
                  if (field_count != 0) {
                    uVar9 = 0;
                    do {
                      free(ppcVar1[uVar9]);
                      uVar9 = uVar9 + 1;
                    } while (uVar7 != uVar9);
                  }
                  free(ppcVar1);
                }
                pfVar2 = local_50;
                pcVar6 = sqlite3_errmsg(local_50->conn);
                pcVar6 = strdup(pcVar6);
                pfVar2->error_msg = pcVar6;
                sqlite3_finalize(local_70);
                return FEED_DB_ERROR;
              }
              sqlite3_clear_bindings(local_70);
              sqlite3_reset(local_70);
            }
            ppcVar1 = local_60;
            if (local_60 != (char **)0x0) {
              if (field_count != 0) {
                uVar8 = 0;
                do {
                  free(ppcVar1[uVar8]);
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
              }
              free(ppcVar1);
              db = local_50;
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 != iVar3);
        }
        sqlite3_finalize(local_70);
        free(local_48);
        fclose(local_68);
        return FEED_DB_SUCCESS;
      }
      if (local_58 != (char **)0x0) {
        free(local_58);
      }
      fclose(__stream);
      pcVar6 = "Failed to read CSV file header";
    }
  }
  pcVar6 = strdup(pcVar6);
  db->error_msg = pcVar6;
  return FEED_DB_ERROR;
}

Assistant:

feed_db_status_t import_csv_file_db(const char *path, const char *table, feed_db_t *db) {
    FILE *fp = fopen(path, "r");

    if (!fp) {
        db->error_msg = strdup("Failed to open .csv file");
        return FEED_DB_ERROR;
    }

    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    if (lines_count < 0) {
        free(record_values);
        fclose(fp);

        db->error_msg = strdup("Failed to count lines in CSV file");
        return FEED_DB_ERROR;
    }

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        fclose(fp);

        db->error_msg = strdup("Failed to read CSV file header");
        return FEED_DB_ERROR;
    }

    // begin_transaction_db(db);

    char *create_query;
    bake_create_uni_query_db(table, field_count, field_names, &create_query);

    char *error_msg;
    db->rc = sqlite3_exec(db->conn, create_query, NULL, NULL, &error_msg);

    free(create_query);
    free_cstr_arr(field_names, field_count);

    if (db->rc) {
        if (error_msg != NULL) {
            db->error_msg = strdup(error_msg);
            sqlite3_free(error_msg);
        } else {
            db->error_msg = strdup("Failed to create a table");
        }
        fclose(fp);
        free(record_values);
        return FEED_DB_ERROR;
    }

    char *insert_query;
    bake_insert_uni_query_db(table, field_count, &insert_query);

    sqlite3_stmt *stmt;
    sqlite3_prepare_v2(db->conn, insert_query, -1, &stmt, NULL);

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            for (int j = 0; j < field_count; j++)
                sqlite3_bind_text(stmt, j + 1, record_values[j], -1, SQLITE_STATIC);

            db->rc = sqlite3_step(stmt);
            if (db->rc != SQLITE_DONE) {
                fclose(fp);
                free(insert_query);
                free_cstr_arr(record_values, field_count);
                db->error_msg = strdup(sqlite3_errmsg(db->conn));
                sqlite3_finalize(stmt);
                return FEED_DB_ERROR;
            }

            sqlite3_clear_bindings(stmt);
            sqlite3_reset(stmt);
            record_count++;
        }
        free_cstr_arr(record_values, field_count);
    }

    sqlite3_finalize(stmt);

    // end_transaction_db(db);

    free(insert_query);
    fclose(fp);

    return FEED_DB_SUCCESS;
}